

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O2

void cff_face_done(FT_Face cffface)

{
  FT_Memory memory;
  long lVar1;
  FT_Memory memory_00;
  FT_Memory memory_01;
  uint uVar2;
  CFF_Face face;
  ulong uVar3;
  
  if (cffface != (FT_Face)0x0) {
    memory = cffface->memory;
    if (*(long *)&cffface[3].units_per_EM != 0) {
      (**(code **)(*(long *)&cffface[3].units_per_EM + 0x18))(cffface);
    }
    lVar1 = cffface[4].bbox.yMin;
    if (lVar1 != 0) {
      memory_00 = *(FT_Memory *)(lVar1 + 0x10);
      cff_index_done((CFF_Index)(lVar1 + 0xb8));
      cff_index_done((CFF_Index)(lVar1 + 0x578));
      cff_index_done((CFF_Index)(lVar1 + 0x38));
      cff_index_done((CFF_Index)(lVar1 + 0x538));
      uVar2 = *(uint *)(lVar1 + 0xb30);
      if (uVar2 != 0) {
        for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
          cff_subfont_done(memory_00,*(CFF_SubFont *)(lVar1 + 0xb38 + uVar3 * 8));
          uVar2 = *(uint *)(lVar1 + 0xb30);
        }
        ft_mem_free(memory_00,*(void **)(lVar1 + 0xb38));
        *(undefined8 *)(lVar1 + 0xb38) = 0;
      }
      *(undefined4 *)(lVar1 + 0xf8) = 0;
      *(undefined8 *)(lVar1 + 0x100) = 0;
      *(undefined4 *)(lVar1 + 0x108) = 0;
      memory_01 = *(FT_Memory *)(*(long *)(lVar1 + 8) + 0x38);
      ft_mem_free(memory_01,*(void **)(lVar1 + 0x528));
      *(undefined8 *)(lVar1 + 0x528) = 0;
      *(undefined4 *)(lVar1 + 0x530) = 0;
      ft_mem_free(memory_01,*(void **)(lVar1 + 0x520));
      *(undefined4 *)(lVar1 + 0x510) = 0;
      *(undefined8 *)(lVar1 + 0x518) = 0;
      *(undefined8 *)(lVar1 + 0x520) = 0;
      cff_vstore_done((CFF_VStoreRec *)(lVar1 + 0x1398),memory_00);
      cff_subfont_done(memory_00,(CFF_SubFont)(lVar1 + 0x668));
      if (*(long *)(lVar1 + 0x1340) != 0) {
        FT_Stream_ReleaseFrame(*(FT_Stream *)(lVar1 + 8),(FT_Byte **)(lVar1 + 0x1340));
      }
      *(undefined4 *)(lVar1 + 0x1348) = 0;
      *(undefined1 *)(lVar1 + 0x1338) = 0;
      *(undefined4 *)(lVar1 + 0x133c) = 0;
      ft_mem_free(memory_00,*(void **)(lVar1 + 0x1370));
      *(undefined8 *)(lVar1 + 0x1370) = 0;
      ft_mem_free(memory_00,*(void **)(lVar1 + 0x638));
      *(undefined8 *)(lVar1 + 0x638) = 0;
      ft_mem_free(memory_00,*(void **)(lVar1 + 0x640));
      *(undefined8 *)(lVar1 + 0x640) = 0;
      ft_mem_free(memory_00,*(void **)(lVar1 + 0x650));
      *(undefined8 *)(lVar1 + 0x650) = 0;
      ft_mem_free(memory_00,*(void **)(lVar1 + 0x658));
      *(undefined8 *)(lVar1 + 0x658) = 0;
      if (*(code **)(lVar1 + 0x1390) != (code *)0x0) {
        (**(code **)(lVar1 + 0x1390))(*(undefined8 *)(lVar1 + 5000));
        ft_mem_free(memory_00,*(void **)(lVar1 + 5000));
        *(undefined8 *)(lVar1 + 5000) = 0;
      }
      ft_mem_free(memory_00,*(void **)(lVar1 + 0x13b8));
      *(undefined8 *)(lVar1 + 0x13b8) = 0;
      ft_mem_free(memory,(void *)cffface[4].bbox.yMin);
      cffface[4].bbox.yMin = 0;
    }
    if (cffface[3].glyph != (FT_GlyphSlot_conflict)0x0) {
      (*(code *)((cffface[3].glyph)->metrics).horiBearingY)(cffface);
    }
    cffface[4].size = (FT_Size)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_face_done( FT_Face  cffface )         /* CFF_Face */
  {
    CFF_Face      face = (CFF_Face)cffface;
    FT_Memory     memory;
    SFNT_Service  sfnt;


    if ( !face )
      return;

    memory = cffface->memory;
    sfnt   = (SFNT_Service)face->sfnt;

    if ( sfnt )
      sfnt->done_face( face );

    {
      CFF_Font  cff = (CFF_Font)face->extra.data;


      if ( cff )
      {
        cff_font_done( cff );
        FT_FREE( face->extra.data );
      }
    }

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    cff_done_blend( face );
    face->blend = NULL;
#endif
  }